

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O2

void __thiscall setup::directory_entry::load(directory_entry *this,istream *is,info *i)

{
  byte bVar1;
  unsigned_short uVar2;
  uint16_t uVar3;
  uint uVar4;
  logger *plVar5;
  size_t i_1;
  ulong uVar6;
  enum_type *peVar7;
  ulong uVar8;
  ostringstream *poVar9;
  flag_type result;
  undefined1 local_1b0 [384];
  
  if ((i->version).value < 0x1030000) {
    util::load<int,util::little_endian>(is);
  }
  local_1b0._0_8_ = &this->name;
  local_1b0._8_4_ = i->codepage;
  local_1b0._16_8_ = &(i->header).lead_bytes;
  util::operator>>(is,(encoded_string *)local_1b0);
  item::load_condition_data(&this->super_item,is,i);
  if ((i->version).value + 0xfbfff500 < 0xf500) {
    util::binary_string::load(is,&this->permissions);
  }
  else {
    (this->permissions)._M_string_length = 0;
    *(this->permissions)._M_dataplus._M_p = '\0';
  }
  uVar4 = 0;
  if (0x2000aff < (i->version).value) {
    uVar4 = util::load<int,util::little_endian>(is);
  }
  this->attributes = uVar4;
  windows_version_range::load(&(this->super_item).winver,is,&i->version);
  if ((i->version).value < 0x4010000) {
    this->permission = -1;
LAB_0012fe46:
    uVar3 = version::bits(&i->version);
    bVar1 = util::load<unsigned_char,util::little_endian>(is);
    uVar6 = (ulong)bVar1;
    if (uVar3 == 0x10) {
      result._flags.super__Base_bitset<1UL>._M_w = (Type)(_Base_bitset<1UL>)0x0;
      peVar7 = &(anonymous_namespace)::stored_inno_directory_options_0::values;
      for (uVar8 = 0; uVar8 != 3; uVar8 = uVar8 + 1) {
        if ((uVar6 >> (uVar8 & 0x3f) & 1) != 0) {
          flags<setup::component_entry::flags_Enum_,_5UL>::operator|=
                    ((flags<setup::component_entry::flags_Enum_,_5UL> *)&result,*peVar7);
          uVar6 = uVar6 & ~(1L << ((byte)uVar8 & 0x3f));
        }
        peVar7 = peVar7 + 1;
      }
      if (uVar6 == 0) goto LAB_00130086;
      local_1b0._0_4_ = 2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 8),"Unexpected ");
      plVar5 = logger::operator<<((logger *)local_1b0,
                                  &enum_names<setup::directory_entry::flags_Enum_>::name);
      poVar9 = &plVar5->buffer;
      std::operator<<((ostream *)poVar9," flags: ");
      *(uint *)(&plVar5->field_0x20 + *(long *)(*(long *)poVar9 + -0x18)) =
           *(uint *)(&plVar5->field_0x20 + *(long *)(*(long *)poVar9 + -0x18)) & 0xffffffb5 | 8;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    }
    else {
      result._flags.super__Base_bitset<1UL>._M_w = (Type)(_Base_bitset<1UL>)0x0;
      peVar7 = &(anonymous_namespace)::stored_inno_directory_options_0::values;
      for (uVar8 = 0; uVar8 != 3; uVar8 = uVar8 + 1) {
        if ((uVar6 >> (uVar8 & 0x3f) & 1) != 0) {
          flags<setup::component_entry::flags_Enum_,_5UL>::operator|=
                    ((flags<setup::component_entry::flags_Enum_,_5UL> *)&result,*peVar7);
          uVar6 = uVar6 & ~(1L << ((byte)uVar8 & 0x3f));
        }
        peVar7 = peVar7 + 1;
      }
      if (uVar6 == 0) goto LAB_00130086;
      local_1b0._0_4_ = 2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 8),"Unexpected ");
      plVar5 = logger::operator<<((logger *)local_1b0,
                                  &enum_names<setup::directory_entry::flags_Enum_>::name);
      poVar9 = &plVar5->buffer;
      std::operator<<((ostream *)poVar9," flags: ");
      *(uint *)(&plVar5->field_0x20 + *(long *)(*(long *)poVar9 + -0x18)) =
           *(uint *)(&plVar5->field_0x20 + *(long *)(*(long *)poVar9 + -0x18)) & 0xffffffb5 | 8;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    }
  }
  else {
    uVar2 = util::load<short,util::little_endian>(is);
    this->permission = uVar2;
    if ((i->version).value < 0x5020000) goto LAB_0012fe46;
    bVar1 = util::load<unsigned_char,util::little_endian>(is);
    result._flags.super__Base_bitset<1UL>._M_w = (Type)(_Base_bitset<1UL>)0x0;
    uVar8 = (ulong)bVar1;
    peVar7 = &(anonymous_namespace)::stored_inno_directory_options_1::values;
    for (uVar6 = 0; uVar6 != 5; uVar6 = uVar6 + 1) {
      if ((uVar8 >> (uVar6 & 0x3f) & 1) != 0) {
        flags<setup::component_entry::flags_Enum_,_5UL>::operator|=
                  ((flags<setup::component_entry::flags_Enum_,_5UL> *)&result,*peVar7);
        uVar8 = uVar8 & ~(1L << ((byte)uVar6 & 0x3f));
      }
      peVar7 = peVar7 + 1;
    }
    if (uVar8 == 0) goto LAB_00130086;
    local_1b0._0_4_ = 2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 8),"Unexpected ");
    plVar5 = logger::operator<<((logger *)local_1b0,
                                &enum_names<setup::directory_entry::flags_Enum_>::name);
    poVar9 = &plVar5->buffer;
    std::operator<<((ostream *)poVar9," flags: ");
    *(uint *)(&plVar5->field_0x20 + *(long *)(*(long *)poVar9 + -0x18)) =
         *(uint *)(&plVar5->field_0x20 + *(long *)(*(long *)poVar9 + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  }
  *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
       *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
  logger::~logger((logger *)local_1b0);
LAB_00130086:
  (this->options)._flags.super__Base_bitset<1UL>._M_w =
       (_WordT)result._flags.super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

void directory_entry::load(std::istream & is, const info & i) {
	
	if(i.version < INNO_VERSION(1, 3, 0)) {
		(void)util::load<boost::uint32_t>(is); // uncompressed size of the entry
	}
	
	is >> util::encoded_string(name, i.codepage, i.header.lead_bytes);
	
	load_condition_data(is, i);
	
	if(i.version >= INNO_VERSION(4, 0, 11) && i.version < INNO_VERSION(4, 1, 0)) {
		is >> util::binary_string(permissions);
	} else {
		permissions.clear();
	}
	
	if(i.version >= INNO_VERSION(2, 0, 11)) {
		attributes = util::load<boost::uint32_t>(is);
	} else {
		attributes = 0;
	}
	
	load_version_data(is, i.version);
	
	if(i.version >= INNO_VERSION(4, 1, 0)) {
		permission = util::load<boost::int16_t>(is);
	} else {
		permission = boost::int16_t(-1);
	}
	
	if(i.version >= INNO_VERSION(5, 2, 0)) {
		options = stored_flags<stored_inno_directory_options_1>(is).get();
	} else if(i.version.bits() != 16) {
		options = stored_flags<stored_inno_directory_options_0>(is).get();
	} else {
		options = stored_flags<stored_inno_directory_options_0, 16>(is).get();
	}
	
}